

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigOutDec.c
# Opt level: O0

Vec_Ptr_t * Saig_ManFindPrimes(Aig_Man_t *pAig,int nLits,int fVerbose)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  lit lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *pVVar9;
  undefined8 uVar10;
  int nNodes2;
  int nNodes1;
  int fCompl1;
  int fCompl0;
  int Lits [10];
  uint local_74;
  int RetValue;
  int m;
  int i1;
  int i0;
  Vec_Int_t *vMarks;
  Vec_Int_t *vCube;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vPrimes;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pRoot;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  int fVerbose_local;
  int nLits_local;
  Aig_Man_t *pAig_local;
  
  pCnf._0_4_ = fVerbose;
  pCnf._4_4_ = nLits;
  _fVerbose_local = pAig;
  if ((nLits != 1) && (nLits != 2)) {
    __assert_fail("nLits == 1 || nLits == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigOutDec.c"
                  ,0x38,"Vec_Ptr_t *Saig_ManFindPrimes(Aig_Man_t *, int, int)");
  }
  if (9 < nLits) {
    __assert_fail("nLits < 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigOutDec.c"
                  ,0x39,"Vec_Ptr_t *Saig_ManFindPrimes(Aig_Man_t *, int, int)");
  }
  iVar2 = Aig_ManCoNum(pAig);
  pSat = (sat_solver *)Cnf_DeriveSimple(pAig,iVar2);
  pObj0 = (Aig_Obj_t *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)pSat,1,0);
  pObj = Aig_ManCo(_fVerbose_local,0);
  pMiter = Aig_ObjFanin0(pObj);
  p = Aig_ManDfsNodes(_fVerbose_local,&pMiter,1);
  p_00 = Vec_PtrAlloc(100);
  iVar2 = Vec_PtrSize(p);
  p_01 = Vec_IntStart(iVar2);
  lVar1 = *(long *)(pSat->Mem).BookMarkE;
  iVar2 = Aig_ObjId(pObj);
  fCompl1 = toLitCond(*(int *)(lVar1 + (long)iVar2 * 4),1);
  for (m = 0; iVar2 = Vec_PtrSize(p), m < iVar2; m = m + 1) {
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry(p,m);
    if (pObj1 != pMiter) {
      lVar1 = *(long *)(pSat->Mem).BookMarkE;
      iVar2 = Aig_ObjId(pObj1);
      fCompl0 = toLitCond(*(int *)(lVar1 + (long)iVar2 * 4),
                          (uint)(*(ulong *)&pObj1->field_0x18 >> 3) & 1);
      iVar2 = sat_solver_solve((sat_solver *)pObj0,&fCompl1,Lits,0,0,0,0);
      if (iVar2 == -1) {
        pVVar9 = Vec_IntAlloc(1);
        iVar2 = Aig_ObjId(pObj1);
        lVar5 = toLitCond(iVar2,(uint)(*(ulong *)&pObj1->field_0x18 >> 3) & 1);
        Vec_IntPush(pVVar9,lVar5);
        Vec_PtrPush(p_00,pVVar9);
        if ((int)pCnf != 0) {
          uVar3 = Aig_ObjId(pObj1);
          uVar10 = 0x2b;
          if ((*(ulong *)&pObj1->field_0x18 >> 3 & 1) != 0) {
            uVar10 = 0x2d;
          }
          printf("Adding prime %d%c\n",(ulong)uVar3,uVar10);
        }
        Vec_IntWriteEntry(p_01,m,1);
      }
    }
  }
  uVar3 = Vec_PtrSize(p_00);
  if (1 < pCnf._4_4_) {
    for (m = 0; iVar2 = Vec_PtrSize(p), m < iVar2; m = m + 1) {
      pObj1 = (Aig_Obj_t *)Vec_PtrEntry(p,m);
      RetValue = m;
      if (pObj1 != pMiter) {
LAB_00878efd:
        RetValue = RetValue + 1;
        iVar2 = Vec_PtrSize(p);
        if (RetValue < iVar2) {
          pRoot = (Aig_Obj_t *)Vec_PtrEntry(p,RetValue);
          if (((pRoot != pMiter) && (iVar2 = Vec_IntEntry(p_01,m), iVar2 == 0)) &&
             (iVar2 = Vec_IntEntry(p_01,RetValue), iVar2 == 0)) {
            for (local_74 = 0; (int)local_74 < 3; local_74 = local_74 + 1) {
              uVar8 = local_74 & 1;
              uVar4 = (int)local_74 >> 1 & 1;
              lVar1 = *(long *)(pSat->Mem).BookMarkE;
              iVar2 = Aig_ObjId(pObj1);
              fCompl0 = toLitCond(*(int *)(lVar1 + (long)iVar2 * 4),
                                  uVar8 ^ (uint)(*(ulong *)&pObj1->field_0x18 >> 3) & 1);
              lVar1 = *(long *)(pSat->Mem).BookMarkE;
              iVar2 = Aig_ObjId(pRoot);
              Lits[0] = toLitCond(*(int *)(lVar1 + (long)iVar2 * 4),
                                  uVar4 ^ (uint)(*(ulong *)&pRoot->field_0x18 >> 3) & 1);
              iVar2 = sat_solver_solve((sat_solver *)pObj0,&fCompl1,Lits + 1,0,0,0,0);
              if (iVar2 == -1) {
                pVVar9 = Vec_IntAlloc(2);
                iVar2 = Aig_ObjId(pObj1);
                lVar5 = toLitCond(iVar2,uVar8 ^ (uint)(*(ulong *)&pObj1->field_0x18 >> 3) & 1);
                Vec_IntPush(pVVar9,lVar5);
                iVar2 = Aig_ObjId(pRoot);
                lVar5 = toLitCond(iVar2,uVar4 ^ (uint)(*(ulong *)&pRoot->field_0x18 >> 3) & 1);
                Vec_IntPush(pVVar9,lVar5);
                Vec_PtrPush(p_00,pVVar9);
                if ((int)pCnf != 0) {
                  uVar6 = Aig_ObjId(pObj1);
                  uVar7 = 0x2b;
                  if (uVar8 != ((uint)(*(ulong *)&pObj1->field_0x18 >> 3) & 1)) {
                    uVar7 = 0x2d;
                  }
                  uVar8 = Aig_ObjId(pRoot);
                  uVar10 = 0x2b;
                  if (uVar4 != ((uint)(*(ulong *)&pRoot->field_0x18 >> 3) & 1)) {
                    uVar10 = 0x2d;
                  }
                  printf("Adding prime %d%c %d%c\n",(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,uVar10);
                }
                break;
              }
            }
          }
          goto LAB_00878efd;
        }
      }
    }
  }
  iVar2 = Vec_PtrSize(p_00);
  uVar8 = Vec_PtrSize(p);
  printf("Property cone size = %6d    1-lit primes = %5d    2-lit primes = %5d\n",(ulong)uVar8,
         (ulong)uVar3,(ulong)(iVar2 - uVar3));
  sat_solver_delete((sat_solver *)pObj0);
  Cnf_DataFree((Cnf_Dat_t *)pSat);
  Vec_PtrFree(p);
  Vec_IntFree(p_01);
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs decomposition of the property output.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Saig_ManFindPrimes( Aig_Man_t * pAig, int nLits, int fVerbose )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj0, * pObj1, * pRoot, * pMiter;
    Vec_Ptr_t * vPrimes, * vNodes;
    Vec_Int_t * vCube, * vMarks;
    int i0, i1, m, RetValue, Lits[10];
    int fCompl0, fCompl1, nNodes1, nNodes2;
    assert( nLits == 1 || nLits == 2 );
    assert( nLits < 10 );

    // create SAT solver
    pCnf = Cnf_DeriveSimple( pAig, Aig_ManCoNum(pAig) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );

    // collect nodes in the property output cone
    pMiter = Aig_ManCo( pAig, 0 );
    pRoot  = Aig_ObjFanin0( pMiter );
    vNodes = Aig_ManDfsNodes( pAig, &pRoot, 1 );
    // sort nodes by level and remove the last few
 
    // try single nodes
    vPrimes = Vec_PtrAlloc( 100 );
    // create assumptions
    vMarks = Vec_IntStart( Vec_PtrSize(vNodes) );
    Lits[0] = toLitCond( pCnf->pVarNums[Aig_ObjId(pMiter)], 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj0, i0 )
    if ( pObj0 != pRoot )
    {
        // create assumptions
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj0)], pObj0->fPhase );
        // solve the problem
        RetValue = sat_solver_solve( pSat, Lits, Lits+2, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue == l_False )
        {
            vCube = Vec_IntAlloc( 1 );
            Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj0), pObj0->fPhase) );
            Vec_PtrPush( vPrimes, vCube );
            if ( fVerbose )
            printf( "Adding prime %d%c\n", Aig_ObjId(pObj0),  pObj0->fPhase?'-':'+' );
            Vec_IntWriteEntry( vMarks, i0, 1 );
        }
    }
    nNodes1 = Vec_PtrSize(vPrimes);
    if ( nLits > 1 )
    {
        // try adding second literal
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj0, i0 )
        if ( pObj0 != pRoot )
        Vec_PtrForEachEntryStart( Aig_Obj_t *, vNodes, pObj1, i1, i0+1 )
        if ( pObj1 != pRoot )
        {
            if ( Vec_IntEntry(vMarks,i0) || Vec_IntEntry(vMarks,i1) )
                continue;
            for ( m = 0; m < 3; m++ )
            {
                fCompl0 =  m & 1;
                fCompl1 = (m >> 1) & 1;
                // create assumptions
                Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj0)], fCompl0 ^ pObj0->fPhase );
                Lits[2] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj1)], fCompl1 ^ pObj1->fPhase );
                // solve the problem
                RetValue = sat_solver_solve( pSat, Lits, Lits+3, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( RetValue == l_False )
                {
                    vCube = Vec_IntAlloc( 2 );
                    Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj0), fCompl0 ^ pObj0->fPhase) );
                    Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj1), fCompl1 ^ pObj1->fPhase) );
                    Vec_PtrPush( vPrimes, vCube );
                    if ( fVerbose )
                    printf( "Adding prime %d%c %d%c\n", 
                        Aig_ObjId(pObj0), (fCompl0 ^ pObj0->fPhase)?'-':'+', 
                        Aig_ObjId(pObj1), (fCompl1 ^ pObj1->fPhase)?'-':'+' );
                    break;
                }
            }
        }
    }
    nNodes2 = Vec_PtrSize(vPrimes) - nNodes1;

    printf( "Property cone size = %6d    1-lit primes = %5d    2-lit primes = %5d\n", 
        Vec_PtrSize(vNodes), nNodes1, nNodes2 );

    // clean up
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vMarks );
    return vPrimes;
}